

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# app_parameters.cpp
# Opt level: O0

void __thiscall
jessilib::app_parameters::app_parameters
          (app_parameters *this,int param_1,char **in_argv,char **in_envp,set_type *in_stop_args)

{
  jessilib *this_00;
  char **in_ntarg_array;
  char **in_ntarg_array_00;
  vector<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  local_90;
  vector<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  local_68;
  string_type local_50;
  set_type *local_30;
  set_type *in_stop_args_local;
  char **in_envp_local;
  char **in_argv_local;
  app_parameters *paStack_10;
  int param_1_local;
  app_parameters *this_local;
  
  local_30 = in_stop_args;
  in_stop_args_local = (set_type *)in_envp;
  in_envp_local = in_argv;
  in_argv_local._4_4_ = param_1;
  paStack_10 = this;
  get_first_arg<char_const>(&local_50,(jessilib *)in_argv,in_argv);
  this_00 = (jessilib *)get_next_args<char_const>(in_envp_local);
  vectorize_ntargs<char8_t,char_const>(&local_68,this_00,in_ntarg_array);
  vectorize_ntargs<char8_t,char_const>(&local_90,(jessilib *)in_stop_args_local,in_ntarg_array_00);
  app_parameters(this,&local_50,&local_68,&local_90,local_30);
  std::
  vector<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  ::~vector(&local_90);
  std::
  vector<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  ::~vector(&local_68);
  std::__cxx11::u8string::~u8string((u8string *)&local_50);
  return;
}

Assistant:

app_parameters::app_parameters(int, const char** in_argv, const char** in_envp, const set_type& in_stop_args)
	: app_parameters{ get_first_arg(in_argv), vectorize_ntargs(get_next_args(in_argv)), vectorize_ntargs(in_envp), in_stop_args } {
	// Empty ctor body
}